

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cc
# Opt level: O0

void __thiscall prometheus::detail::Endpoint::~Endpoint(Endpoint *this)

{
  bool bVar1;
  Endpoint *this_local;
  
  CivetServer::removeHandler(this->server_,&this->uri_);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->auth_handler_);
  if (bVar1) {
    CivetServer::removeAuthHandler(this->server_,&this->uri_);
  }
  std::unique_ptr<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
  ::~unique_ptr(&this->auth_handler_);
  std::
  unique_ptr<prometheus::detail::MetricsHandler,_std::default_delete<prometheus::detail::MetricsHandler>_>
  ::~unique_ptr(&this->metrics_handler_);
  std::shared_ptr<prometheus::Registry>::~shared_ptr(&this->endpoint_registry_);
  std::__cxx11::string::~string((string *)&this->uri_);
  return;
}

Assistant:

Endpoint::~Endpoint() {
  server_.removeHandler(uri_);
  if (auth_handler_) {
    server_.removeAuthHandler(uri_);
  }
}